

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_time_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_time_excluded_ae");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    if (entry == (archive_entry *)0x0) {
      archive_set_error(_a,0x16,"entry is NULL");
      wVar2 = L'\xffffffe7';
    }
    else {
      wVar2 = L'\0';
      if ((_a[1].magic & 2) != 0) {
        wVar2 = time_excluded((archive_match *)_a,entry);
        return wVar2;
      }
    }
  }
  return wVar2;
}

Assistant:

int
archive_match_time_excluded(struct archive *_a,
    struct archive_entry *entry)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_excluded_ae");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	/* If we don't have inclusion time set at all, the entry is always
	 * not excluded. */
	if ((a->setflag & TIME_IS_SET) == 0)
		return (0);
	return (time_excluded(a, entry));
}